

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp_cache_server.cpp
# Opt level: O1

void __thiscall cppcms::impl::tcp_cache_service::session::save(session *this)

{
  uint64_t uVar1;
  pointer pcVar2;
  element_type *peVar3;
  string value;
  string sid;
  undefined1 *local_60 [2];
  undefined1 local_50 [16];
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  if ((this->hin_).size < 0x20) {
    (this->hout_).opcode = 5;
  }
  else {
    uVar1 = (this->hin_).operations.fetch.current_gen;
    pcVar2 = (this->data_in_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start;
    local_40[0] = local_30;
    std::__cxx11::string::
    _M_construct<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>>
              ((string *)local_40,pcVar2,pcVar2 + 0x20);
    local_60[0] = local_50;
    std::__cxx11::string::
    _M_construct<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>>
              ((string *)local_60,
               (this->data_in_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start + 0x20,
               (this->data_in_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_finish);
    peVar3 = (this->sessions_).
             super___shared_ptr<cppcms::sessions::session_storage,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    (**peVar3->_vptr_session_storage)(peVar3,local_40,uVar1,local_60);
    (this->hout_).opcode = 6;
    if (local_60[0] != local_50) {
      operator_delete(local_60[0]);
    }
    if (local_40[0] != local_30) {
      operator_delete(local_40[0]);
    }
  }
  return;
}

Assistant:

void save()
	{
		if(hin_.size < 32)
		{
			hout_.opcode=opcodes::error;
			return;
		}
		time_t timeout=to_time_t(hin_.operations.session_save.timeout);
		std::string sid(data_in_.begin(),data_in_.begin()+32);
		std::string value(data_in_.begin()+32,data_in_.end());
		sessions_->save(sid,timeout,value);
		hout_.opcode=opcodes::done;
	}